

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O1

void Timidity::PrintArt(char *type,CONNECTIONLIST *art,CONNECTION *artList)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  LONG *pLVar4;
  ulong uVar5;
  undefined1 *puVar6;
  char *pcVar7;
  
  printf("%s Connections:\n",type);
  if (art->cConnections != 0) {
    pLVar4 = &artList->lScale;
    uVar5 = 0;
    do {
      pcVar2 = SourceToString(((CONNECTION *)(pLVar4 + -2))->usSource);
      pcVar3 = SourceToString(*(USHORT *)((long)pLVar4 + -6));
      uVar1 = *(ushort *)(pLVar4 + -1);
      if (uVar1 < 0x115) {
        if (uVar1 < 0x80) {
          pcVar7 = "NONE";
          switch(uVar1) {
          case 0:
            break;
          case 1:
            pcVar7 = "ATTENUATION";
            break;
          default:
            goto switchD_00325c3f_caseD_2;
          case 3:
            pcVar7 = "PITCH";
            break;
          case 4:
            pcVar7 = "PAN";
            break;
          case 5:
            pcVar7 = "KEYNUMBER";
            break;
          case 0x10:
            pcVar7 = "LEFT";
            break;
          case 0x11:
            pcVar7 = "RIGHT";
            break;
          case 0x12:
            pcVar7 = "CENTER";
            break;
          case 0x13:
            pcVar7 = "LEFTREAR";
            break;
          case 0x14:
            pcVar7 = "RIGHTREAR";
            break;
          case 0x15:
            pcVar7 = "LFE_CHANNEL";
          }
        }
        else if (uVar1 < 0x104) {
          if (uVar1 == 0x80) {
            pcVar7 = "CHORUS";
          }
          else {
            if (uVar1 != 0x81) goto switchD_00325c3f_caseD_2;
            pcVar7 = "REVERB";
          }
        }
        else if (uVar1 == 0x104) {
          pcVar7 = "LFO_FREQUENCY";
        }
        else if (uVar1 == 0x105) {
          pcVar7 = "LFO_STARTDELAY";
        }
        else {
          if (uVar1 != 0x114) goto switchD_00325c3f_caseD_2;
          pcVar7 = "VIB_FREQUENCY";
        }
      }
      else if (uVar1 < 0x30a) {
        switch(uVar1) {
        case 0x206:
          pcVar7 = "EG1_ATTACKTIME";
          break;
        case 0x207:
          pcVar7 = "EG1_DECAYTIME";
          break;
        case 0x208:
switchD_00325c3f_caseD_2:
          mysnprintf(DestinationToString(unsigned_short)::unknown,0x20,"UNKNOWN (0x%04x)");
          pcVar7 = DestinationToString(unsigned_short)::unknown;
          break;
        case 0x209:
          pcVar7 = "EG1_RELEASETIME";
          break;
        case 0x20a:
          pcVar7 = "EG1_SUSTAINLEVEL";
          break;
        case 0x20b:
          pcVar7 = "EG1_DELAYTIME";
          break;
        case 0x20c:
          pcVar7 = "EG1_HOLDTIME";
          break;
        case 0x20d:
          pcVar7 = "EG1_SHUTDOWNTIME";
          break;
        default:
          if (uVar1 != 0x115) goto switchD_00325c3f_caseD_2;
          pcVar7 = "VIB_STARTDELAY";
        }
      }
      else {
        switch(uVar1) {
        case 0x30a:
          pcVar7 = "EG2_ATTACKTIME";
          break;
        case 0x30b:
          pcVar7 = "EG2_DECAYTIME";
          break;
        case 0x30c:
          goto switchD_00325c3f_caseD_2;
        case 0x30d:
          pcVar7 = "EG2_RELEASETIME";
          break;
        case 0x30e:
          pcVar7 = "EG2_SUSTAINLEVEL";
          break;
        case 0x30f:
          pcVar7 = "EG2_DELAYTIME";
          break;
        case 0x310:
          pcVar7 = "EG2_HOLDTIME";
          break;
        default:
          if (uVar1 == 0x500) {
            pcVar7 = "FILTER_CUTOFF";
          }
          else {
            if (uVar1 != 0x501) goto switchD_00325c3f_caseD_2;
            pcVar7 = "FILTER_Q";
          }
        }
      }
      if (*(USHORT *)((long)pLVar4 + -2) < 4) {
        puVar6 = &DAT_005e1aa0 +
                 *(int *)(&DAT_005e1aa0 + (ulong)(uint)*(USHORT *)((long)pLVar4 + -2) * 4);
      }
      else {
        mysnprintf(TransformToString(unsigned_short)::unknown,0x20,"UNKNOWN (0x%04x)");
        puVar6 = TransformToString(unsigned_short)::unknown;
      }
      printf("  Source: %s, Control: %s, Destination: %s, Transform: %s, Scale: %d\n",pcVar2,pcVar3,
             pcVar7,puVar6,(ulong)(uint)*pLVar4);
      uVar5 = uVar5 + 1;
      pLVar4 = pLVar4 + 3;
    } while (uVar5 < art->cConnections);
  }
  return;
}

Assistant:

static void PrintArt(const char *type, CONNECTIONLIST *art, CONNECTION *artList)
{
	DWORD i;
	printf("%s Connections:\n", type);
	for ( i = 0; i < art->cConnections; ++i ) {
		printf("  Source: %s, Control: %s, Destination: %s, Transform: %s, Scale: %d\n",
			SourceToString(artList[i].usSource),
			SourceToString(artList[i].usControl),
			DestinationToString(artList[i].usDestination),
			TransformToString(artList[i].usTransform),
			artList[i].lScale);
	}
}